

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O0

void gnilk::Logger::EnableAllLoggers(void)

{
  LogManager *pLVar1;
  anon_class_1_0_00000001 local_29;
  LogDelegate local_28;
  
  pLVar1 = LogManager::Instance();
  std::function<bool(std::shared_ptr<gnilk::Log>const&)>::
  function<gnilk::Logger::EnableAllLoggers()::__0,void>
            ((function<bool(std::shared_ptr<gnilk::Log>const&)> *)&local_28,&local_29);
  LogManager::IterateLogs(pLVar1,&local_28);
  std::function<bool_(const_std::shared_ptr<gnilk::Log>_&)>::~function(&local_28);
  pLVar1 = LogManager::Instance();
  LogManager::SetEnableLogOnCreate(pLVar1,true);
  return;
}

Assistant:

void Logger::EnableAllLoggers() {
    LogManager::Instance().IterateLogs([](const Log::Ref &log) {
       log->SetEnabled(true);
       return true;
    });
    LogManager::Instance().SetEnableLogOnCreate(true);
}